

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

word * Ifn_NtkDeriveTruth(Ifn_Ntk_t *p,int *pValues)

{
  uint uVar1;
  word *pwVar2;
  word *pwVar3;
  int *piVar4;
  word *pwVar5;
  word *pIn0;
  word *pTemp;
  int nValues;
  word *pTruth;
  int *pFans;
  int nFans;
  int iStart;
  int iVar;
  int f;
  int v;
  int i;
  int *pValues_local;
  Ifn_Ntk_t *p_local;
  
  for (f = 0; f < p->nInps; f = f + 1) {
    nFans = 0;
    for (iVar = 0; iVar < p->nParsVNum; iVar = iVar + 1) {
      if (p->Values[p->nParsVIni + f * p->nParsVNum + iVar] != 0) {
        nFans = (1 << ((byte)iVar & 0x1f)) + nFans;
      }
    }
    pwVar2 = Ifn_ObjTruth(p,f);
    pwVar3 = Ifn_ElemTruth(p,nFans);
    Abc_TtCopy(pwVar2,pwVar3,p->nWords,0);
  }
  f = p->nInps;
  do {
    if (p->nObjs <= f) {
      pwVar2 = Ifn_ObjTruth(p,p->nObjs + -1);
      return pwVar2;
    }
    uVar1 = *(uint *)(p->Nodes + f) >> 3 & 0x1f;
    piVar4 = p->Nodes[f].Fanins;
    pwVar2 = Ifn_ObjTruth(p,f);
    if (((undefined1  [48])p->Nodes[f] & (undefined1  [48])0x7) == (undefined1  [48])0x3) {
      Abc_TtFill(pwVar2,p->nWords);
      for (iStart = 0; iStart < (int)uVar1; iStart = iStart + 1) {
        pwVar3 = Ifn_ObjTruth(p,piVar4[iStart]);
        Abc_TtAnd(pwVar2,pwVar2,pwVar3,p->nWords,0);
      }
    }
    else if (((undefined1  [48])p->Nodes[f] & (undefined1  [48])0x7) == (undefined1  [48])0x4) {
      Abc_TtClear(pwVar2,p->nWords);
      for (iStart = 0; iStart < (int)uVar1; iStart = iStart + 1) {
        pwVar3 = Ifn_ObjTruth(p,piVar4[iStart]);
        Abc_TtXor(pwVar2,pwVar2,pwVar3,p->nWords,0);
      }
    }
    else if (((undefined1  [48])p->Nodes[f] & (undefined1  [48])0x7) == (undefined1  [48])0x5) {
      if (uVar1 != 3) {
        __assert_fail("nFans == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x3ac,"word *Ifn_NtkDeriveTruth(Ifn_Ntk_t *, int *)");
      }
      pwVar3 = Ifn_ObjTruth(p,*piVar4);
      pwVar5 = Ifn_ObjTruth(p,p->Nodes[f].Fanins[1]);
      pIn0 = Ifn_ObjTruth(p,p->Nodes[f].Fanins[2]);
      Abc_TtMux(pwVar2,pwVar3,pwVar5,pIn0,p->nWords);
    }
    else {
      if (((undefined1  [48])p->Nodes[f] & (undefined1  [48])0x7) != (undefined1  [48])0x6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x3c1,"word *Ifn_NtkDeriveTruth(Ifn_Ntk_t *, int *)");
      }
      pwVar3 = Ifn_ObjTruth(p,p->nObjs);
      Abc_TtClear(pwVar2,p->nWords);
      for (iVar = 0; iVar < 1 << (sbyte)uVar1; iVar = iVar + 1) {
        if (pValues[(int)((*(uint *)(p->Nodes + f) >> 8 & 0xff) + iVar)] != 0) {
          Abc_TtFill(pwVar3,p->nWords);
          for (iStart = 0; iStart < (int)uVar1; iStart = iStart + 1) {
            if ((iVar >> ((byte)iStart & 0x1f) & 1U) == 0) {
              pwVar5 = Ifn_ObjTruth(p,piVar4[iStart]);
              Abc_TtSharp(pwVar3,pwVar3,pwVar5,p->nWords);
            }
            else {
              pwVar5 = Ifn_ObjTruth(p,piVar4[iStart]);
              Abc_TtAnd(pwVar3,pwVar3,pwVar5,p->nWords,0);
            }
          }
          Abc_TtOr(pwVar2,pwVar2,pwVar3,p->nWords);
        }
      }
    }
    f = f + 1;
  } while( true );
}

Assistant:

word * Ifn_NtkDeriveTruth( Ifn_Ntk_t * p, int * pValues )
{
    int i, v, f, iVar, iStart;
    // elementary variables
    for ( i = 0; i < p->nInps; i++ )
    {
        // find variable
        iStart = p->nParsVIni + i * p->nParsVNum;
        for ( v = iVar = 0; v < p->nParsVNum; v++ )
            if ( p->Values[iStart+v] )
                iVar += (1 << v);
        // assign variable
        Abc_TtCopy( Ifn_ObjTruth(p, i), Ifn_ElemTruth(p, iVar), p->nWords, 0 );
    }
    // internal variables
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        word * pTruth = Ifn_ObjTruth( p, i );
        if ( p->Nodes[i].Type == IFN_DSD_AND )
        {
            Abc_TtFill( pTruth, p->nWords );
            for ( f = 0; f < nFans; f++ )
                Abc_TtAnd( pTruth, pTruth, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_XOR )
        {
            Abc_TtClear( pTruth, p->nWords );
            for ( f = 0; f < nFans; f++ )
                Abc_TtXor( pTruth, pTruth, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            Abc_TtMux( pTruth, Ifn_ObjTruth(p, pFans[0]), Ifn_ObjTruth(p, pFans[1]), Ifn_ObjTruth(p, pFans[2]), p->nWords );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_PRIME )
        {
            int nValues = (1 << nFans);
            word * pTemp = Ifn_ObjTruth(p, p->nObjs);
            Abc_TtClear( pTruth, p->nWords );
            for ( v = 0; v < nValues; v++ )
            {
                if ( pValues[p->Nodes[i].iFirst + v] == 0 )
                    continue;
                Abc_TtFill( pTemp, p->nWords );
                for ( f = 0; f < nFans; f++ )
                    if ( (v >> f) & 1 )
                        Abc_TtAnd( pTemp, pTemp, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
                    else
                        Abc_TtSharp( pTemp, pTemp, Ifn_ObjTruth(p, pFans[f]), p->nWords );
                Abc_TtOr( pTruth, pTruth, pTemp, p->nWords );
            }
        }
        else assert( 0 );
//Dau_DsdPrintFromTruth( pTruth, p->nVars );
    }
    return Ifn_ObjTruth(p, p->nObjs-1);
}